

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::Edits::Iterator::toString(Iterator *this,UnicodeString *sb)

{
  ConstChar16Ptr local_f0;
  ConstChar16Ptr local_e8;
  ConstChar16Ptr local_e0;
  ConstChar16Ptr local_d8;
  ConstChar16Ptr local_d0;
  ConstChar16Ptr local_c8;
  ConstChar16Ptr local_c0;
  ConstChar16Ptr local_b8;
  ConstChar16Ptr local_b0 [5];
  char16_t *local_88;
  char16_t *local_78;
  char16_t *local_68;
  char16_t *local_58;
  char16_t *local_48;
  char16_t *local_38;
  char16_t *local_28;
  
  local_b0[0].p_ = L"{ src[";
  UnicodeString::append(sb,local_b0,-1);
  local_28 = local_b0[0].p_;
  ICU_Utility::appendNumber(sb,this->srcIndex,10,1);
  local_b8.p_ = L"..";
  UnicodeString::append(sb,&local_b8,-1);
  local_38 = local_b8.p_;
  ICU_Utility::appendNumber(sb,this->oldLength_ + this->srcIndex,10,1);
  if (this->changed == '\0') {
    local_c8.p_ = L"] ≡ dest[";
    UnicodeString::append(sb,&local_c8,-1);
    local_58 = local_c8.p_;
  }
  else {
    local_c0.p_ = L"] ⇝ dest[";
    UnicodeString::append(sb,&local_c0,-1);
    local_48 = local_c0.p_;
  }
  ICU_Utility::appendNumber(sb,this->destIndex,10,1);
  local_d0.p_ = L"..";
  UnicodeString::append(sb,&local_d0,-1);
  local_68 = local_d0.p_;
  ICU_Utility::appendNumber(sb,this->newLength_ + this->destIndex,10,1);
  if (this->changed == '\0') {
    local_f0.p_ = L"] (no-change) }";
    UnicodeString::append(sb,&local_f0,-1);
  }
  else {
    local_d8.p_ = L"], repl[";
    UnicodeString::append(sb,&local_d8,-1);
    local_78 = local_d8.p_;
    ICU_Utility::appendNumber(sb,this->replIndex,10,1);
    local_e0.p_ = L"..";
    UnicodeString::append(sb,&local_e0,-1);
    local_88 = local_e0.p_;
    ICU_Utility::appendNumber(sb,this->newLength_ + this->replIndex,10,1);
    local_e8.p_ = L"] }";
    UnicodeString::append(sb,&local_e8,-1);
  }
  return sb;
}

Assistant:

UnicodeString& Edits::Iterator::toString(UnicodeString& sb) const {
    sb.append(u"{ src[", -1);
    ICU_Utility::appendNumber(sb, srcIndex);
    sb.append(u"..", -1);
    ICU_Utility::appendNumber(sb, srcIndex + oldLength_);
    if (changed) {
        sb.append(u"] ⇝ dest[", -1);
    } else {
        sb.append(u"] ≡ dest[", -1);
    }
    ICU_Utility::appendNumber(sb, destIndex);
    sb.append(u"..", -1);
    ICU_Utility::appendNumber(sb, destIndex + newLength_);
    if (changed) {
        sb.append(u"], repl[", -1);
        ICU_Utility::appendNumber(sb, replIndex);
        sb.append(u"..", -1);
        ICU_Utility::appendNumber(sb, replIndex + newLength_);
        sb.append(u"] }", -1);
    } else {
        sb.append(u"] (no-change) }", -1);
    }
    return sb;
}